

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

PropertyId __thiscall
Js::ScriptContext::GetOrAddPropertyIdTracked
          (ScriptContext *this,CharacterBuffer<char16_t> *propName)

{
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  
  local_20 = (PropertyRecord *)0x0;
  ThreadContext::GetOrAddPropertyId(this->threadContext,propName,&local_20);
  TrackPid(this,local_20);
  return local_20->pid;
}

Assistant:

PropertyId ScriptContext::GetOrAddPropertyIdTracked(JsUtil::CharacterBuffer<WCHAR> const& propName)
    {
        Js::PropertyRecord const * propertyRecord = nullptr;
        threadContext->GetOrAddPropertyId(propName, &propertyRecord);

        this->TrackPid(propertyRecord);

        return propertyRecord->GetPropertyId();
    }